

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlWorker.cpp
# Opt level: O0

void __thiscall
adios2::query::XmlWorker::ConstructTree(XmlWorker *this,RangeTree *host,xml_node *node)

{
  bool bVar1;
  Relation r;
  pointer pxVar2;
  char_t *pcVar3;
  RangeTree *pRVar4;
  RangeTree *in_RDX;
  RangeTree *in_RSI;
  RangeTree subNode;
  xml_node *opNode;
  xml_named_node_iterator __end2_1;
  xml_named_node_iterator __begin2_1;
  xml_object_range<pugi::xml_named_node_iterator> *__range2_1;
  string opStr;
  string valStr;
  xml_node *rangeNode;
  xml_named_node_iterator __end2;
  xml_named_node_iterator __begin2;
  xml_object_range<pugi::xml_named_node_iterator> *__range2;
  string relationStr;
  RangeTree *in_stack_fffffffffffffc38;
  xml_named_node_iterator *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc50;
  Op in_stack_fffffffffffffc54;
  string *value;
  allocator *paVar5;
  Op op;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  RangeTree local_308;
  xml_node *local_2d0;
  xml_named_node_iterator local_2c8;
  xml_named_node_iterator local_2b0;
  xml_object_range<pugi::xml_named_node_iterator> local_298;
  xml_object_range<pugi::xml_named_node_iterator> *local_268;
  string local_260 [32];
  string local_240 [38];
  allocator local_21a;
  allocator in_stack_fffffffffffffde7;
  string *in_stack_fffffffffffffde8;
  xml_node *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  undefined1 local_1f1 [41];
  string local_1c8 [38];
  allocator local_1a2;
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [40];
  string local_150 [32];
  xml_node *local_130;
  xml_named_node_iterator local_128;
  xml_named_node_iterator local_110;
  xml_object_range<pugi::xml_named_node_iterator> local_f8;
  xml_object_range<pugi::xml_named_node_iterator> *local_c8;
  string local_c0 [38];
  allocator local_9a;
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [40];
  string local_38 [24];
  xml_node *in_stack_ffffffffffffffe0;
  RangeTree *this_00;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"value",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"in query",&local_99);
  helper::XMLAttribute
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (bool)in_stack_fffffffffffffde7);
  pxVar2 = std::unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>::
           operator->((unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_> *)
                      0xd45caf);
  pcVar3 = pugi::xml_attribute::value(pxVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar3,&local_9a);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a);
  std::unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>::~unique_ptr
            ((unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  this_00 = in_RSI;
  std::__cxx11::string::string(local_c0,local_38);
  r = strToRelation((string *)in_stack_fffffffffffffc38);
  RangeTree::SetRelation(in_RSI,r);
  std::__cxx11::string::~string(local_c0);
  pugi::xml_node::children
            ((xml_node *)in_RSI,
             (char_t *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
  local_c8 = &local_f8;
  pugi::xml_object_range<pugi::xml_named_node_iterator>::begin(&local_110,local_c8);
  pugi::xml_object_range<pugi::xml_named_node_iterator>::end(&local_128,local_c8);
  while( true ) {
    bVar1 = pugi::xml_named_node_iterator::operator!=(&local_110,&local_128);
    if (!bVar1) break;
    local_130 = pugi::xml_named_node_iterator::operator*(&local_110);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"value",&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"in query",&local_1a1);
    helper::XMLAttribute
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (bool)in_stack_fffffffffffffde7);
    pxVar2 = std::unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>::
             operator->((unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>
                         *)0xd45ee0);
    pRVar4 = (RangeTree *)pugi::xml_attribute::value(pxVar2);
    paVar5 = &local_1a2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,(char *)pRVar4,paVar5);
    op = (Op)((ulong)paVar5 >> 0x20);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a2);
    std::unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>::~unique_ptr
              ((unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    value = (string *)local_1f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1f1 + 1),"compare",(allocator *)value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffde8,"in query",(allocator *)&stack0xfffffffffffffde7);
    helper::XMLAttribute
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (bool)in_stack_fffffffffffffde7);
    pxVar2 = std::unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>::
             operator->((unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>
                         *)0xd46006);
    pcVar3 = pugi::xml_attribute::value(pxVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,pcVar3,&local_21a);
    std::allocator<char>::~allocator((allocator<char> *)&local_21a);
    std::unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>::~unique_ptr
              ((unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffde7);
    std::__cxx11::string::~string((string *)(local_1f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1f1);
    std::__cxx11::string::string(local_240,local_1c8);
    in_stack_fffffffffffffc54 = strToQueryOp((string *)in_stack_fffffffffffffc38);
    std::__cxx11::string::string(local_260,local_150);
    RangeTree::AddLeaf(pRVar4,op,value);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_150);
    pugi::xml_named_node_iterator::operator++(in_stack_fffffffffffffc40);
  }
  pugi::xml_node::children((xml_node *)in_RSI,(char_t *)CONCAT17(bVar1,in_stack_fffffffffffffcb8));
  local_268 = &local_298;
  pugi::xml_object_range<pugi::xml_named_node_iterator>::begin(&local_2b0,local_268);
  pugi::xml_object_range<pugi::xml_named_node_iterator>::end(&local_2c8,local_268);
  while( true ) {
    bVar1 = pugi::xml_named_node_iterator::operator!=(&local_2b0,&local_2c8);
    if (!bVar1) break;
    local_2d0 = pugi::xml_named_node_iterator::operator*(&local_2b0);
    pRVar4 = &local_308;
    RangeTree::RangeTree(pRVar4);
    ConstructTree((XmlWorker *)this_00,in_RDX,in_stack_ffffffffffffffe0);
    RangeTree::AddNode(pRVar4,in_stack_fffffffffffffc38);
    RangeTree::~RangeTree(pRVar4);
    pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)pRVar4);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void XmlWorker::ConstructTree(RangeTree &host, const pugi::xml_node &node)
{
    std::string relationStr = adios2::helper::XMLAttribute("value", node, "in query")->value();
    host.SetRelation(adios2::query::strToRelation(relationStr));
    for (const pugi::xml_node &rangeNode : node.children("range"))
    {
        std::string valStr = adios2::helper::XMLAttribute("value", rangeNode, "in query")->value();
        std::string opStr = adios2::helper::XMLAttribute("compare", rangeNode, "in query")->value();

        host.AddLeaf(adios2::query::strToQueryOp(opStr), valStr);
    }

    for (const pugi::xml_node &opNode : node.children("op"))
    {
        adios2::query::RangeTree subNode;
        ConstructTree(subNode, opNode);
        host.AddNode(subNode);
    }
}